

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O3

void __thiscall
DemoScripts::TrainVanillaIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  int iVar1;
  size_t sVar2;
  INeuron *pIVar3;
  ILayer *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  int activationId;
  ulong uVar8;
  float extraout_XMM0_Da;
  float fVar9;
  float S;
  vector<float,_std::allocator<float>_> deltas;
  vector<float,_std::allocator<float>_> softMax;
  vector<float,_std::allocator<float>_> result;
  Dataset data;
  VanillaSynapseBuilder synapseBuilder;
  DenseVanillaLayer input;
  DenseVanillaLayer hidden;
  DenseVanillaLayer output;
  float local_628;
  float local_61c;
  vector<float,_std::allocator<float>_> local_618;
  vector<float,_std::allocator<float>_> local_5f8;
  vector<float,_std::allocator<float>_> local_5d8;
  vector<float,_std::allocator<float>_> local_5b8;
  vector<float,_std::allocator<float>_> local_5a0;
  Dataset local_588;
  VanillaSynapseBuilder local_528 [16];
  INeuronBuilder local_518;
  undefined1 local_510 [8];
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  size_t local_4e8;
  INeuronBuilder *local_4e0;
  undefined8 local_4d8;
  undefined1 local_4d0 [8];
  _Alloc_hider local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  size_t local_4a8;
  INeuronBuilder *local_4a0;
  undefined8 local_498;
  undefined1 local_490 [8];
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  size_t local_468;
  INeuronBuilder *local_460;
  undefined8 local_458;
  ILayer local_450;
  ILayer local_2f0;
  ILayer local_190;
  
  local_518._vptr_INeuronBuilder = (_func_int **)_ITM_registerTMCloneTable;
  local_490._0_4_ = 0.0;
  local_488._M_p = (pointer)&local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"input","");
  local_468 = 4;
  local_458._0_4_ = 0.0;
  local_458._4_4_ = 0.0;
  local_460 = &local_518;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)&local_450,(LayerMeta *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_p != &local_478) {
    operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
  }
  local_4d0._0_4_ = 0.0;
  local_4c8._M_p = (pointer)&local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"hidden1","");
  local_4a8 = 0xf;
  local_498._0_4_ = 0.0;
  local_498._4_4_ = 0.0;
  local_4a0 = &local_518;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)&local_2f0,(LayerMeta *)local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &local_4b8) {
    operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
  }
  local_510._0_4_ = 0.0;
  local_508._M_p = (pointer)&local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"output","");
  local_4e8 = 3;
  local_4d8._0_4_ = 0.0;
  local_4d8._4_4_ = 0.0;
  local_4e0 = &local_518;
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)&local_190,(LayerMeta *)local_510);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_p != &local_4f8) {
    operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
  }
  sVar2 = ILayer::GetSize(&local_2f0);
  DenseVanillaLayer::Init((DenseVanillaLayer *)&local_450,sVar2,generator,0.0);
  sVar2 = ILayer::GetSize(&local_190);
  DenseVanillaLayer::Init((DenseVanillaLayer *)&local_450,sVar2,generator,0.0);
  DenseVanillaLayer::Init((DenseVanillaLayer *)&local_450,0,generator,0.0);
  VanillaSynapseBuilder::VanillaSynapseBuilder(local_528,(linear_congruential_engine *)generator);
  ILayer::BindWithNext(&local_450,&local_2f0,(ISynapseBuilder *)local_528);
  ILayer::BindWithNext(&local_2f0,&local_190,(ISynapseBuilder *)local_528);
  local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_588.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_588.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_588.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_588.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_618,path,(allocator *)&local_5d8);
  IRIS::ReadIris((string *)&local_618,&local_588,0.2);
  if ((pointer *)
      local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  DATA_CONVERSION::ConvertDataToTimings(&local_588,1.0);
  iVar6 = 0;
  do {
    local_628 = 0.0;
    if (local_588.xTrain.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_588.xTrain.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_628 = 0.0;
      uVar7 = 0;
      do {
        for (uVar8 = 0; sVar2 = ILayer::GetSize(&local_450), uVar8 < sVar2; uVar8 = uVar8 + 1) {
          pIVar3 = ILayer::operator[](&local_450,uVar8);
          (**pIVar3->_vptr_INeuron)
                    (0,local_588.xTrain.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar7].
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8],pIVar3);
        }
        DenseVanillaLayer::Forward((DenseVanillaLayer *)&local_2f0);
        DenseVanillaLayer::Forward((DenseVanillaLayer *)&local_190);
        local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_61c = 0.0;
        sVar2 = ILayer::GetSize(&local_190);
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_5a0,sVar2,(allocator_type *)&local_5f8);
        for (uVar8 = 0; sVar2 = ILayer::GetSize(&local_190), uVar8 < sVar2; uVar8 = uVar8 + 1) {
          pIVar3 = ILayer::operator[](&local_190,uVar8);
          (*pIVar3->_vptr_INeuron[4])(pIVar3);
          local_5a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = extraout_XMM0_Da;
        }
        fVar9 = SoftMaxLoss(&local_5a0,
                            local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar7],&local_5d8,&local_618,
                            &local_61c);
        DenseVanillaLayer::Backward((DenseVanillaLayer *)&local_190,&local_618);
        local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        DenseVanillaLayer::Backward((DenseVanillaLayer *)&local_2f0,&local_5f8);
        local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        DenseVanillaLayer::Backward((DenseVanillaLayer *)&local_450,&local_5b8);
        if (local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        DenseVanillaLayer::GradStep((DenseVanillaLayer *)&local_190,1,0.1,0.1,0.0,false,0.0,false);
        DenseVanillaLayer::GradStep((DenseVanillaLayer *)&local_2f0,1,0.1,0.1,0.0,false,0.0,false);
        DenseVanillaLayer::GradStep((DenseVanillaLayer *)&local_450,1,0.1,0.1,0.0,true,0.0,false);
        pIVar4 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)&local_190);
        iVar1 = (*pIVar4->_vptr_ILayer[7])(pIVar4);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                  ((long *)CONCAT44(extraout_var,iVar1));
        pIVar4 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)&local_2f0);
        iVar1 = (*pIVar4->_vptr_ILayer[7])(pIVar4);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                  ((long *)CONCAT44(extraout_var_00,iVar1));
        pIVar4 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)&local_450);
        iVar1 = (*pIVar4->_vptr_ILayer[7])(pIVar4);
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x28))
                  ((long *)CONCAT44(extraout_var_01,iVar1));
        if (local_5a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_5d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_618.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_628 = local_628 + fVar9;
        uVar7 = uVar7 + 1;
        uVar8 = ((long)local_588.xTrain.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_588.xTrain.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar7 <= uVar8 && uVar8 - uVar7 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loss for epoch: ",0x10);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," is: ",5);
    poVar5 = std::ostream::_M_insert<double>
                       ((double)(local_628 /
                                (float)(ulong)(((long)local_588.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_588.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                              -0x5555555555555555)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 1000);
  if (local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_588.xTest);
  if (local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_588.xTrain);
  ILayer::~ILayer(&local_190);
  ILayer::~ILayer(&local_2f0);
  ILayer::~ILayer(&local_450);
  return;
}

Assistant:

void DemoScripts::TrainVanillaIris( char *path, std::default_random_engine &generator )
{
    size_t IRIS_INPUT = 4;
    size_t IRIS_HIDDEN = 15;
    size_t IRIS_OUTPUT = 3;

    BasicNeuronBuilder neuronBuilder = BasicNeuronBuilder();

    DenseVanillaLayer input = DenseVanillaLayer( {0, "input", IRIS_INPUT, neuronBuilder} );
    DenseVanillaLayer hidden = DenseVanillaLayer( {0, "hidden1", IRIS_HIDDEN, neuronBuilder} );
    DenseVanillaLayer output = DenseVanillaLayer( {0, "output", IRIS_OUTPUT, neuronBuilder} );

    input.Init( hidden.GetSize(), generator, 0 );
    input.Init( output.GetSize(), generator, 0 );
    input.Init( 0, generator, 0 );

    VanillaSynapseBuilder synapseBuilder = VanillaSynapseBuilder( generator );
    input.BindWithNext( hidden, synapseBuilder );
    hidden.BindWithNext( output, synapseBuilder );

    SPIKING_NN::Dataset data;
    IRIS::ReadIris( path, data, 0.2 );
    DATA_CONVERSION::ConvertDataToTimings( data, 1 );

    float EPS = 1e-1;
    float LEARNING_RATE = 0.1;
    float SIMULATION_TIME = 1000;

    for ( int epochId = 0; epochId < SIMULATION_TIME; epochId++ ) {
        float totalLoss = 0.f;
        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            for ( int activationId = 0; activationId < input.GetSize(); ++activationId ) {
                input[activationId]->ProcessInputSpike( 0, data.xTrain[sampleId][activationId] );
            }
            hidden.Forward();
            output.Forward();

            std::vector<float> deltas;
            std::vector<float> softMax;
            float S = 0;
            auto result = std::vector<float>( output.GetSize());
            for ( size_t idx = 0; idx < output.GetSize(); ++idx ) {
                result[idx] = output[idx]->GetOutput();
            }
            float loss = SoftMaxLoss( result, data.yTrain[sampleId], softMax, deltas, &S );
            totalLoss += loss;

            output.Backward( deltas ), hidden.Backward( {} ), input.Backward( {} );

            output.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, false, 0, false );
            hidden.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, false, 0, false );
            input.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, true, 0, false );

            output.ResetPotentials().ResetGrad().ResetStats();
            hidden.ResetPotentials().ResetGrad().ResetStats();
            input.ResetPotentials().ResetGrad().ResetStats();
        }
        std::cout << "Loss for epoch: " << epochId << " is: " << totalLoss / data.xTrain.size() << "\n";
    }
}